

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDyndepCollation.cxx
# Opt level: O0

Value * anon_unknown.dwarf_10a3caa::CollationInformationBmiInstallation
                  (Value *__return_storage_ptr__,cmGeneratorTarget *gt,string *config)

{
  bool bVar1;
  MessageLevel MVar2;
  vector<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
  *this;
  pointer pcVar3;
  cmGeneratorTarget *pcVar4;
  string *value;
  Value *pVVar5;
  cmInstallCxxModuleBmiGenerator *local_170;
  string local_150;
  Value local_130;
  Value local_108;
  char *local_e0;
  char *msg_level;
  Value local_b8;
  Value local_80;
  undefined1 local_51;
  cmInstallCxxModuleBmiGenerator *local_50;
  cmInstallCxxModuleBmiGenerator *bmig;
  unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_> *ig;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
  *__range1;
  cmInstallCxxModuleBmiGenerator *bmi_gen;
  string *config_local;
  cmGeneratorTarget *gt_local;
  Value *tdi_bmi_info;
  
  __range1 = (vector<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
              *)0x0;
  this = cmMakefile::GetInstallGenerators(gt->Makefile);
  __end1 = std::
           vector<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
           ::begin(this);
  ig = (unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_> *)
       std::
       vector<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
       ::end(this);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_*,_std::vector<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>_>
                                     *)&ig), bVar1) {
    bmig = (cmInstallCxxModuleBmiGenerator *)
           __gnu_cxx::
           __normal_iterator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_*,_std::vector<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>_>
           ::operator*(&__end1);
    pcVar3 = std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>::get
                       ((unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_> *)
                        bmig);
    if (pcVar3 == (pointer)0x0) {
      local_170 = (cmInstallCxxModuleBmiGenerator *)0x0;
    }
    else {
      local_170 = (cmInstallCxxModuleBmiGenerator *)
                  __dynamic_cast(pcVar3,&cmInstallGenerator::typeinfo,
                                 &cmInstallCxxModuleBmiGenerator::typeinfo,0);
    }
    local_50 = local_170;
    if ((local_170 != (cmInstallCxxModuleBmiGenerator *)0x0) &&
       (pcVar4 = cmInstallCxxModuleBmiGenerator::GetTarget(local_170), pcVar4 == gt)) {
      __range1 = (vector<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
                  *)local_50;
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_*,_std::vector<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>_>
    ::operator++(&__end1);
  }
  if (__range1 ==
      (vector<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
       *)0x0) {
    Json::Value::Value(__return_storage_ptr__,nullValue);
  }
  else {
    local_51 = 0;
    Json::Value::Value(__return_storage_ptr__,objectValue);
    value = cmInstallCxxModuleBmiGenerator::GetFilePermissions_abi_cxx11_
                      ((cmInstallCxxModuleBmiGenerator *)__range1);
    Json::Value::Value(&local_80,value);
    pVVar5 = Json::Value::operator[](__return_storage_ptr__,"permissions");
    Json::Value::operator=(pVVar5,&local_80);
    Json::Value::~Value(&local_80);
    cmInstallCxxModuleBmiGenerator::GetDestination
              ((string *)&msg_level,(cmInstallCxxModuleBmiGenerator *)__range1,config);
    Json::Value::Value(&local_b8,(String *)&msg_level);
    pVVar5 = Json::Value::operator[](__return_storage_ptr__,"destination");
    Json::Value::operator=(pVVar5,&local_b8);
    Json::Value::~Value(&local_b8);
    std::__cxx11::string::~string((string *)&msg_level);
    local_e0 = "";
    MVar2 = cmInstallCxxModuleBmiGenerator::GetMessageLevel
                      ((cmInstallCxxModuleBmiGenerator *)__range1);
    switch(MVar2) {
    case MessageDefault:
      break;
    case MessageAlways:
      local_e0 = "MESSAGE_ALWAYS";
      break;
    case MessageLazy:
      local_e0 = "MESSAGE_LAZY";
      break;
    case MessageNever:
      local_e0 = "MESSAGE_NEVER";
    }
    Json::Value::Value(&local_108,local_e0);
    pVVar5 = Json::Value::operator[](__return_storage_ptr__,"message-level");
    Json::Value::operator=(pVVar5,&local_108);
    Json::Value::~Value(&local_108);
    cmInstallCxxModuleBmiGenerator::GetScriptLocation
              (&local_150,(cmInstallCxxModuleBmiGenerator *)__range1,config);
    Json::Value::Value(&local_130,&local_150);
    pVVar5 = Json::Value::operator[](__return_storage_ptr__,"script-location");
    Json::Value::operator=(pVVar5,&local_130);
    Json::Value::~Value(&local_130);
    std::__cxx11::string::~string((string *)&local_150);
  }
  return __return_storage_ptr__;
}

Assistant:

Json::Value CollationInformationBmiInstallation(cmGeneratorTarget const* gt,
                                                std::string const& config)
{
  cmInstallCxxModuleBmiGenerator const* bmi_gen = nullptr;
  for (auto const& ig : gt->Makefile->GetInstallGenerators()) {
    if (auto const* bmig =
          dynamic_cast<cmInstallCxxModuleBmiGenerator const*>(ig.get())) {
      if (bmig->GetTarget() == gt) {
        bmi_gen = bmig;
        continue;
      }
    }
  }
  if (bmi_gen) {
    Json::Value tdi_bmi_info = Json::objectValue;

    tdi_bmi_info["permissions"] = bmi_gen->GetFilePermissions();
    tdi_bmi_info["destination"] = bmi_gen->GetDestination(config);
    const char* msg_level = "";
    switch (bmi_gen->GetMessageLevel()) {
      case cmInstallGenerator::MessageDefault:
        break;
      case cmInstallGenerator::MessageAlways:
        msg_level = "MESSAGE_ALWAYS";
        break;
      case cmInstallGenerator::MessageLazy:
        msg_level = "MESSAGE_LAZY";
        break;
      case cmInstallGenerator::MessageNever:
        msg_level = "MESSAGE_NEVER";
        break;
    }
    tdi_bmi_info["message-level"] = msg_level;
    tdi_bmi_info["script-location"] = bmi_gen->GetScriptLocation(config);

    return tdi_bmi_info;
  }
  return Json::nullValue;
}